

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_keym_v2.cpp
# Opt level: O1

void __thiscall intel_keym_v2_t::signature_t::~signature_t(signature_t *this)

{
  pointer pcVar1;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__signature_t_00185aa0;
  pcVar1 = (this->m_signature)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == &(this->m_signature).field_2) {
    return;
  }
  operator_delete(pcVar1);
  return;
}

Assistant:

intel_keym_v2_t::signature_t::~signature_t() {
    _clean_up();
}